

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main_p(int argc,char **argv)

{
  size_type *psVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  __uid_t _Var4;
  int iVar5;
  __gid_t __gid;
  int *piVar6;
  off_t oVar7;
  XInputSimulator *this;
  ssize_t sVar8;
  undefined8 *puVar9;
  int y;
  ulong uVar10;
  input_event event;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  on_exit(exit_cleanup,(void *)0x0);
  process_command_line_arguments(argc,argv);
  _Var4 = geteuid();
  if (_Var4 != 0) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Got r00t?");
  }
  if (args.kill == true) {
    kill_existing_process();
  }
  if ((args.start == false) && (((byte)args.flags & 1) == 0)) {
    usage();
    exit(1);
  }
  oVar7 = args.post_size;
  if (args.post_size == 0) {
    if (args.irc_server._M_string_length == 0 && args.http_url._M_string_length == 0) {
      oVar7 = 0;
    }
    else {
      args.post_size = 500000;
      oVar7 = 500000;
    }
  }
  if (((args.keymap._M_string_length != 0) && (((byte)args.flags & 1) == 0)) &&
     (args.us_keymap == true)) {
    error(1,0,"Incompatible flags \'-m\' and \'-u\'. See usage.");
    oVar7 = args.post_size;
  }
  if ((oVar7 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&args.logfile), iVar5 == 0)) {
    error(1,0,"Incompatible flags [--post-size | --post-http] and --output to stdout");
  }
  set_utf8_locale();
  if (((byte)args.flags & 1) == 0) {
    if (args.keymap._M_string_length != 0) goto LAB_00107493;
    determine_system_keymap();
  }
  else {
    if (args.us_keymap == false) {
      determine_system_keymap();
    }
    export_keymap_to_file();
LAB_00107493:
    parse_input_keymap();
  }
  if (args.device._M_string_length == 0) {
    determine_input_device();
    goto LAB_001074ab;
  }
  std::__cxx11::string::rfind(-0x80,0x2f);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/dev/input/","");
  std::__cxx11::string::substr((ulong)&local_70,0x10cc80);
  uVar10 = 0xf;
  if (local_50 != local_40) {
    uVar10 = local_40[0];
  }
  if (uVar10 < (ulong)(local_68 + local_48)) {
    uVar10 = 0xf;
    if (local_70 != local_60) {
      uVar10 = local_60[0];
    }
    if (uVar10 < (ulong)(local_68 + local_48)) goto LAB_001077dc;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_001077dc:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
  }
  local_90._M_dataplus._M_p = (pointer)*puVar9;
  psVar1 = puVar9 + 2;
  if ((size_type *)local_90._M_dataplus._M_p == psVar1) {
    local_90.field_2._M_allocated_capacity = *psVar1;
    local_90.field_2._8_8_ = puVar9[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar1;
  }
  local_90._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)&args.device,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
LAB_001074ab:
  set_signal_handling();
  close(0);
  input_fd = open(args.device._M_dataplus._M_p,0);
  if (input_fd == -1) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Error opening input event device \'%s\'",args.device._M_dataplus._M_p);
  }
  iVar5 = std::__cxx11::string::compare((char *)&args.logfile);
  if (iVar5 == 0) {
    _Var4 = getuid();
    seteuid(_Var4);
    __gid = getgid();
    setegid(__gid);
  }
  this = XInputSimulator::getInstance();
  umask(0x7f);
  iVar5 = access("/var/run/logkeys.pid",0);
  if (iVar5 != -1) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Another process already running? Quitting. (/var/run/logkeys.pid)");
  }
  if ((((byte)args.flags & 0x40) == 0) && (iVar5 = daemon(0,1), iVar5 == -1)) {
    piVar6 = __errno_location();
    error(1,*piVar6,"Failed to become daemon");
  }
  seteuid(0);
  setegid(0);
  if (((byte)args.flags & 0x40) == 0) {
    create_PID_file();
  }
  execute_abi_cxx11_(&local_90,
                     "{ { xset q 2>/dev/null | grep -q -E \'Caps Lock: +on\'; } || { setleds 2>/dev/null | grep -q \'CapsLock on\'; }; } && echo on"
                    );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  sVar8 = read(input_fd,&local_90,0x18);
  if (0 < sVar8) {
    do {
      if (local_90.field_2._M_allocated_capacity._0_2_ != 1) goto LAB_0010771b;
      uVar2 = local_90.field_2._M_allocated_capacity._2_2_;
      uVar3 = local_90.field_2._M_allocated_capacity._4_4_;
      if (enabled != true) goto LAB_001076f0;
      if (1 < local_90.field_2._M_allocated_capacity._4_4_ - 1) goto LAB_0010771b;
      switch(local_90.field_2._M_allocated_capacity._2_2_) {
      case 0x48:
switchD_00107654_caseD_67:
        XInputSimulator::mouseMoveRelative(this,0,-0x14);
        if (uVar2 == 0x4b) {
LAB_001076a7:
          iVar5 = -0x14;
          goto LAB_001076ce;
        }
        if (uVar2 == 0x4d) goto switchD_00107654_caseD_6a;
        if (uVar2 != 0x50) break;
        iVar5 = 0;
        y = 0x14;
        goto LAB_001076d0;
      case 0x49:
      case 0x4a:
      case 0x4c:
      case 0x4e:
      case 0x4f:
        break;
      case 0x4b:
switchD_00107654_caseD_69:
        XInputSimulator::mouseMoveRelative(this,-0x14,0);
        if (uVar2 == 0x4d) goto switchD_00107654_caseD_6a;
        break;
      case 0x50:
switchD_00107654_caseD_6c:
        XInputSimulator::mouseMoveRelative(this,0,0x14);
        if (uVar2 != 0x6a) {
          if (uVar2 != 0x69) break;
          goto LAB_001076a7;
        }
      case 0x4d:
switchD_00107654_caseD_6a:
        iVar5 = 0x14;
LAB_001076ce:
        y = 0;
LAB_001076d0:
        XInputSimulator::mouseMoveRelative(this,iVar5,y);
        break;
      default:
        switch(local_90.field_2._M_allocated_capacity._2_2_) {
        case 0x67:
          goto switchD_00107654_caseD_67;
        case 0x69:
          goto switchD_00107654_caseD_69;
        case 0x6a:
          goto switchD_00107654_caseD_6a;
        case 0x6c:
          goto switchD_00107654_caseD_6c;
        }
      }
      if (uVar3 == 1) {
        if (uVar2 == 0x52) {
          iVar5 = 3;
        }
        else {
          if (uVar2 != 0x4c) {
LAB_001076f0:
            if (uVar2 == 0x61 && uVar3 == 1) {
              enabled = (bool)(enabled ^ 1);
            }
            goto LAB_0010771b;
          }
          iVar5 = 1;
        }
        XInputSimulator::mouseClick(this,iVar5);
      }
LAB_0010771b:
      sVar8 = read(input_fd,&local_90,0x18);
    } while (0 < sVar8);
  }
  exit(0);
}

Assistant:

int main_p(int argc, char **argv)
{
    on_exit(exit_cleanup, NULL);

    process_command_line_arguments(argc, argv);

    if (geteuid()) error(EXIT_FAILURE, errno, "Got r00t?");
    // kill existing logkeys process
    if (args.kill) kill_existing_process();

    // if neither start nor export, that must be an error
    if (!args.start && !(args.flags & FLAG_EXPORT_KEYMAP)) { usage(); exit(EXIT_FAILURE); }

    // if posting remote and post_size not set, set post_size to default [500K bytes]
    if (args.post_size == 0 && (!args.http_url.empty() || !args.irc_server.empty())) {
        args.post_size = 500000;
    }

    // check for incompatible flags
    if (!args.keymap.empty() && (!(args.flags & FLAG_EXPORT_KEYMAP) && args.us_keymap)) {             // exporting uses args.keymap also
        error(EXIT_FAILURE, 0, "Incompatible flags '-m' and '-u'. See usage.");
    }

    // check for incompatible flags: if posting remote and output is set to stdout
    if (args.post_size != 0 && ( args.logfile == "-" )) {
        error(EXIT_FAILURE, 0, "Incompatible flags [--post-size | --post-http] and --output to stdout");
    }

    set_utf8_locale();

    if (args.flags & FLAG_EXPORT_KEYMAP) {
        if (!args.us_keymap)
            determine_system_keymap();
        export_keymap_to_file();
        // = exit(0)
    }
    else if (!args.keymap.empty())             // custom keymap in use
        parse_input_keymap();
    else
        determine_system_keymap();

    if (args.device.empty()) {             // no device given with -d switch
        determine_input_device();
    }
    else {             // event device supplied as -d argument
        std::string::size_type i = args.device.find_last_of('/');
        args.device = (std::string(INPUT_EVENT_PATH) + args.device.substr(i == std::string::npos ? 0 : i + 1));
    }

    set_signal_handling();

    close(STDIN_FILENO);
    // leave stderr open

    // open input device for reading
    input_fd = open(args.device.c_str(), O_RDONLY);
    if (input_fd == -1) {
        error(EXIT_FAILURE, errno, "Error opening input event device '%s'", args.device.c_str());
    }

    // if log file is other than default, then better seteuid() to the getuid() in order to ensure user can't write to where she shouldn't!
    if (args.logfile == DEFAULT_LOG_FILE) {
        seteuid(getuid());
        setegid(getgid());
    }

    // mouskee
    XInputSimulator &sim = XInputSimulator::getInstance();
    // mouskee

    // open log file (if file doesn't exist, create it with safe 0600 permissions)
    umask(0177);

    if (access(PID_FILE, F_OK) != -1)             // PID file already exists
        error(EXIT_FAILURE, errno, "Another process already running? Quitting. (" PID_FILE ")");

    if (!(args.flags & FLAG_NO_DAEMON)) {
        int noclose = 1;                         // don't close streams (stderr used)
        if (daemon(0, noclose) == -1)                         // become daemon
            error(EXIT_FAILURE, errno, "Failed to become daemon");
    }

    // now we need those privileges back in order to create system-wide PID_FILE
    seteuid(0); setegid(0);
    if (!(args.flags & FLAG_NO_DAEMON)) {
        create_PID_file();
    }

    unsigned int scan_code, prev_code = 0;             // the key code of the pressed key (some codes are from "scan code set 1", some are different (see <linux/input.h>)
    struct input_event event;
    bool capslock_in_effect = execute(COMMAND_STR_CAPSLOCK_STATE).size() >= 2;
    bool shift_in_effect = false;
    bool altgr_in_effect = false;
    bool ctrl_in_effect = false;             // used for identifying Ctrl+C / Ctrl+D

    // infinite loop: exit gracefully by receiving SIGHUP, SIGINT or SIGTERM (of which handler closes input_fd)
    while (read(input_fd, &event, sizeof(struct input_event)) > 0) {

// these event.value-s aren't defined in <linux/input.h> ?
#define EV_MAKE   1  // when key pressed
#define EV_BREAK  0  // when key released
#define EV_REPEAT 2  // when key switches to repeating after short delay

        if (event.type != EV_KEY) continue;                         // keyboard events are always of type EV_KEY

        scan_code = event.code;
        // on key repeat ; must check before on key press
        // on key press
        if (enabled) {
            if (event.value == EV_REPEAT || event.value == EV_MAKE) {
                if (scan_code == KEY_UP || scan_code == KEY_KP8)
                    sim.mouseMoveRelative(0, -20);

                if (scan_code == KEY_DOWN || scan_code == KEY_KP2)
                    sim.mouseMoveRelative(0, 20);

                if (scan_code == KEY_LEFT || scan_code == KEY_KP4)
                    sim.mouseMoveRelative(-20, 0);

                if (scan_code == KEY_RIGHT || scan_code == KEY_KP6)
                    sim.mouseMoveRelative(20, 0);
            }

            if (event.value == EV_MAKE) {
                if (scan_code == KEY_KP5)
                    sim.mouseClick(XIS::LEFT_MOUSE_BUTTON);
                if (scan_code == KEY_KP0)
                    sim.mouseClick(XIS::RIGHT_MOUSE_BUTTON);
            }
            // on key release
            if (event.value == EV_BREAK) {
                if (scan_code == KEY_LEFTSHIFT || scan_code == KEY_RIGHTSHIFT)
                    shift_in_effect = false;
                if (scan_code == KEY_RIGHTALT)
                    altgr_in_effect = false;
                if (scan_code == KEY_LEFTCTRL || scan_code == KEY_RIGHTCTRL) {
                    ctrl_in_effect = false;
                }
            }
        }

        if (event.value == EV_MAKE) {
            if (scan_code == KEY_RIGHTCTRL)
                enabled = !enabled;
        }
    }
    exit(EXIT_SUCCESS);
}